

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O0

void ugui_menu_widget_basic_cell_draw
               (ugui_graphics_t *graphics_ctx,ugui_rect_t *bounds,char *title,char *data)

{
  ushort uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  ugui_point_t a;
  ugui_point_t local_50;
  ugui_size_t local_4c;
  ugui_point_t local_48;
  ugui_size_t data_size;
  ugui_size_t local_40;
  ugui_size_t title_size;
  int y;
  int x;
  int h;
  int w;
  char *data_local;
  char *title_local;
  ugui_rect_t *bounds_local;
  ugui_graphics_t *graphics_ctx_local;
  
  uVar1 = bounds->w;
  uVar2 = bounds->x;
  uVar3 = bounds->y;
  a.x = bounds->x;
  a.y = bounds->y;
  local_40.h = bounds->h;
  local_40.w = uVar1 - 1;
  ugui_graphics_draw_rect(graphics_ctx,a,local_40);
  ugui_font_get_text_size(&font_robotomono_regular_18,title,&data_size);
  local_48.y = uVar3;
  local_48.x = (uVar2 + uVar1 / 2) - data_size.w / 2;
  ugui_graphics_draw_text(graphics_ctx,title,&font_robotomono_regular_18,local_48);
  ugui_font_get_text_size(&font_robotomono_regular_16,data,&local_4c);
  local_50.y = uVar3 + data_size.h + 8;
  local_50.x = (uVar2 + uVar1 / 2) - local_4c.w / 2;
  ugui_graphics_draw_text(graphics_ctx,data,&font_robotomono_regular_16,local_50);
  return;
}

Assistant:

static void ugui_menu_widget_basic_cell_draw(ugui_graphics_t* graphics_ctx, ugui_rect_t* bounds, char* title , char* data)
{
	int w = bounds->w;
	int h = bounds->h;
	int x = bounds->x;
	int y = bounds->y;

	//Surround
	ugui_graphics_draw_rect(graphics_ctx,
	(ugui_point_t) {.x = x, .y = y},
	(ugui_size_t) {.w = w - 1, .h = h});
#if 1
	//Header
	ugui_size_t title_size;
	ugui_font_get_text_size(&font_robotomono_regular_18,
	                        title,
	                        &title_size);

	ugui_graphics_draw_text(graphics_ctx,
	                        title,
	                        &font_robotomono_regular_18,
	(ugui_point_t) {
		.x = x + w / 2 - title_size.w / 2, .y = y
	});

	//Data
	ugui_size_t data_size;
	ugui_font_get_text_size(&font_robotomono_regular_16,
	                        data,
	                        &data_size);

	ugui_graphics_draw_text(graphics_ctx,
	                        data,
	                        &font_robotomono_regular_16,
	(ugui_point_t) {
		.x = x + w / 2 - data_size.w / 2, .y = y + title_size.h + 8
	});
#endif
}